

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall trieste::NodeDef::set_location(NodeDef *this,Location *loc)

{
  __shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *current;
  bool bVar1;
  Node *curr;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  Node root;
  _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  local_68;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_48;
  long local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  anon_class_8_1_ba1d5ea0 local_28;
  
  local_28.loc = loc;
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)this);
  bVar1 = set_location::anon_class_8_1_ba1d5ea0::operator()(&local_28,(Node *)&local_38);
  if (bVar1) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.second._M_current = *(shared_ptr<trieste::NodeDef> **)(local_38 + 0x58);
    local_48.first = (shared_ptr<trieste::NodeDef> *)&local_38;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_68,&local_48);
    while (local_68._M_impl.super__Vector_impl_data._M_start !=
           local_68._M_impl.super__Vector_impl_data._M_finish) {
      current = (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                local_68._M_impl.super__Vector_impl_data._M_finish[-1].second._M_current;
      if (current ==
          *(__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> **)
           ((long)&((((local_68._M_impl.super__Vector_impl_data._M_finish[-1].first)->
                     super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data + 8)) {
        local_68._M_impl.super__Vector_impl_data._M_finish =
             local_68._M_impl.super__Vector_impl_data._M_finish + -1;
      }
      else {
        local_68._M_impl.super__Vector_impl_data._M_finish[-1].second._M_current =
             (shared_ptr<trieste::NodeDef> *)(current + 0x10);
        bVar1 = set_location::anon_class_8_1_ba1d5ea0::operator()(&local_28,(Node *)current);
        if (bVar1) {
          local_48.second._M_current =
               *(shared_ptr<trieste::NodeDef> **)(*(long *)&current->field_0x0 + 0x58);
          local_48.first = (shared_ptr<trieste::NodeDef> *)current;
          std::
          vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
          ::
          emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                    ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                      *)&local_68,&local_48);
        }
      }
    }
    std::
    _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ::~_Vector_base(&local_68);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

void set_location(const Location& loc)
    {
      traverse([&](Node& current) {
        auto& current_loc = current->location_;
        if (current_loc.source)
          return false;
        current_loc = loc;
        return true;
      });
    }